

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Shader::Shader(Shader *this,Type type)

{
  Type type_local;
  Shader *this_local;
  
  this->m_type = type;
  VariableScope::VariableScope(&this->m_globalScope);
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::vector
            (&this->m_globalStatements);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::vector(&this->m_inputs);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::vector(&this->m_uniforms);
  std::vector<rsg::Function_*,_std::allocator<rsg::Function_*>_>::vector(&this->m_functions);
  Function::Function(&this->m_mainFunction,"main");
  std::__cxx11::string::string((string *)&this->m_source);
  return;
}

Assistant:

Shader::Shader (Type type)
	: m_type			(type)
	, m_mainFunction	("main")
{
}